

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O1

bool __thiscall
QCommandLineParserPrivate::registerFoundOption(QCommandLineParserPrivate *this,QString *optionName)

{
  Data<QHashPrivate::Node<QString,_long_long>_> *this_00;
  QStringList *this_01;
  QStringList *pQVar1;
  Node<QString,_long_long> *pNVar2;
  bool bVar3;
  
  this_00 = (this->nameHash).d;
  if (this_00 == (Data<QHashPrivate::Node<QString,_long_long>_> *)0x0) {
    bVar3 = false;
  }
  else {
    pNVar2 = QHashPrivate::Data<QHashPrivate::Node<QString,_long_long>_>::findNode<QString>
                       (this_00,optionName);
    bVar3 = pNVar2 != (Node<QString,_long_long> *)0x0;
  }
  this_01 = &this->optionNames;
  pQVar1 = &this->optionNames;
  if (bVar3 == false) {
    this_01 = &this->unknownOptionNames;
    pQVar1 = &this->unknownOptionNames;
  }
  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
            ((QMovableArrayOps<QString> *)this_01,(pQVar1->d).size,optionName);
  QList<QString>::end(this_01);
  return bVar3;
}

Assistant:

bool QCommandLineParserPrivate::registerFoundOption(const QString &optionName)
{
    if (nameHash.contains(optionName)) {
        optionNames.append(optionName);
        return true;
    } else {
        unknownOptionNames.append(optionName);
        return false;
    }
}